

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall re2::Prog::Inst::Dump_abi_cxx11_(string *__return_storage_ptr__,Inst *this)

{
  char *pcVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = this->out_opcode_;
  switch(uVar4 & 7) {
  case 0:
    uVar2 = (this->field_1).out1_;
    pcVar1 = "alt -> %d | %d";
    break;
  case 1:
    uVar2 = (this->field_1).out1_;
    pcVar1 = "altmatch -> %d | %d";
    break;
  case 2:
    pcVar1 = "/i";
    if ((this->field_1).field_3.foldcase_ == '\0') {
      pcVar1 = "";
    }
    StringPrintf_abi_cxx11_
              (__return_storage_ptr__,"byte%s [%02x-%02x] -> %d",pcVar1,
               (ulong)(this->field_1).field_3.lo_,(ulong)(this->field_1).field_3.hi_,
               (ulong)(uVar4 >> 4));
    return __return_storage_ptr__;
  case 3:
    uVar3 = (this->field_1).out1_;
    pcVar1 = "capture %d -> %d";
    goto LAB_00130cef;
  case 4:
    uVar3 = (this->field_1).out1_;
    pcVar1 = "emptywidth %#x -> %d";
LAB_00130cef:
    uVar2 = uVar4 >> 4;
    goto LAB_00130d1e;
  case 5:
    uVar4 = (this->field_1).out1_;
    pcVar1 = "match! %d";
    goto LAB_00130d47;
  case 6:
    uVar4 = uVar4 >> 4;
    pcVar1 = "nop -> %d";
LAB_00130d47:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar1,(ulong)uVar4);
    return __return_storage_ptr__;
  case 7:
    StringPrintf_abi_cxx11_(__return_storage_ptr__,"fail");
    return __return_storage_ptr__;
  }
  uVar3 = uVar4 >> 4;
LAB_00130d1e:
  StringPrintf_abi_cxx11_(__return_storage_ptr__,pcVar1,(ulong)uVar3,(ulong)uVar2);
  return __return_storage_ptr__;
}

Assistant:

string Prog::Inst::Dump() {
  switch (opcode()) {
    default:
      return StringPrintf("opcode %d", static_cast<int>(opcode()));

    case kInstAlt:
      return StringPrintf("alt -> %d | %d", out(), out1_);

    case kInstAltMatch:
      return StringPrintf("altmatch -> %d | %d", out(), out1_);

    case kInstByteRange:
      return StringPrintf("byte%s [%02x-%02x] -> %d",
                          foldcase_ ? "/i" : "",
                          lo_, hi_, out());

    case kInstCapture:
      return StringPrintf("capture %d -> %d", cap_, out());

    case kInstEmptyWidth:
      return StringPrintf("emptywidth %#x -> %d",
                          static_cast<int>(empty_), out());

    case kInstMatch:
      return StringPrintf("match! %d", match_id());

    case kInstNop:
      return StringPrintf("nop -> %d", out());

    case kInstFail:
      return StringPrintf("fail");
  }
}